

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.cpp
# Opt level: O3

void __thiscall gui::ChatBox::handleMousePress(ChatBox *this,Button button,Vector2f *mouseParent)

{
  Vector2f VVar1;
  Transform *this_00;
  Vector2f *pVVar2;
  size_t pos;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vector2f mouseLocal;
  Vector2f local_30;
  undefined1 local_28 [16];
  
  Widget::handleMousePress(&this->super_Widget,button,mouseParent);
  if (this->autoHide_ != false) {
    return;
  }
  this_00 = Widget::getInverseTransform(&this->super_Widget);
  VVar1 = sf::Transform::transformPoint(this_00,mouseParent);
  local_28._8_4_ = extraout_XMM0_Dc;
  local_28._0_4_ = VVar1.x;
  local_28._4_4_ = VVar1.y;
  local_28._12_4_ = extraout_XMM0_Dd;
  pVVar2 = Widget::getOrigin(&this->super_Widget);
  local_30.y = (float)local_28._4_4_ - (*pVVar2).y;
  local_30.x = (float)local_28._0_4_ - (*pVVar2).x;
  if (button == Left) {
    pos = findClosestLineToMouse(this,&local_30);
    updateSelection(this,pos,false);
  }
  else if (2 < (int)button) goto LAB_00182b22;
  Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::emit
            (&this->onClick,&this->super_Widget,&local_30);
LAB_00182b22:
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::emit
            (&this->onMousePress,&this->super_Widget,button,&local_30);
  return;
}

Assistant:

void ChatBox::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    if (autoHide_) {
        return;
    }
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button == sf::Mouse::Left) {
        updateSelection(findClosestLineToMouse(mouseLocal), false);
    }
    if (button <= sf::Mouse::Middle) {
        onClick.emit(this, mouseLocal);
    }
    onMousePress.emit(this, button, mouseLocal);
}